

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O0

Result __thiscall
anon_unknown.dwarf_831166::QFactoryLoaderIidSearch::operator()
          (QFactoryLoaderIidSearch *this,QtPluginMetaDataKeys key,QCborStreamReader *reader)

{
  long lVar1;
  bool bVar2;
  Result RVar3;
  int in_ESI;
  QString *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 2) {
    QCborStreamReader::readAllString
              ((QCborStreamReader *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    bVar2 = ::operator==(in_RDI,(QLatin1StringView *)
                                CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    *(bool *)&(in_RDI->d).size = bVar2;
    QString::~QString((QString *)0x446816);
    RVar3 = FinishedSearch;
  }
  else {
    RVar3 = skip((QCborStreamReader *)0x4467db);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return RVar3;
  }
  __stack_chk_fail();
}

Assistant:

IterationResult::Result operator()(QtPluginMetaDataKeys key, QCborStreamReader &reader)
    {
        if (key != QtPluginMetaDataKeys::IID)
            return skip(reader);
        matchesIid = (reader.readAllString() == iid);
        return IterationResult::FinishedSearch;
    }